

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

bool qIntegerConversionFromFPHelper<qfloat16,unsigned_short>(qfloat16 from,unsigned_short *to)

{
  float __x;
  ulong uVar1;
  unsigned_short uVar2;
  float fVar3;
  
  uVar1 = (ulong)(from.field_0._1_1_ & 0xfc);
  __x = (float)(*(int *)((long)qfloat16::exponenttable + uVar1) +
               qfloat16::mantissatable
               [((ushort)from.field_0 & 0x3ff) + *(int *)((long)qfloat16::offsettable + uVar1)]);
  if (NAN(__x)) {
    uVar2 = 0;
  }
  else {
    fVar3 = roundf(__x);
    uVar2 = (unsigned_short)(long)fVar3;
  }
  *to = uVar2;
  return !NAN(__x) && !NAN(__x);
}

Assistant:

static bool qIntegerConversionFromFPHelper(From from, To *to)
{
#ifndef Q_CC_GHS
    // actually is_floating_point, but include qfloat16:
    static_assert(std::numeric_limits<From>::is_iec559);
#endif
    static_assert(std::is_integral_v<To>);
    static_assert(sizeof(From) <= sizeof(double));
    const double fromD = static_cast<double>(from);

    if (qt_is_nan(fromD)) {
        *to = To(0);
        return false;
    }

    qint64 result;
    convertDoubleTo(std::round(fromD), &result);
    *to = To(result);
    return true;
}